

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.c
# Opt level: O0

void SetResidualCoeffs_C(int16_t *coeffs,VP8Residual *res)

{
  int n;
  VP8Residual *res_local;
  int16_t *coeffs_local;
  
  res->last = -1;
  n = 0xf;
  do {
    if (n < 0) {
LAB_00190b43:
      res->coeffs = coeffs;
      return;
    }
    if (coeffs[n] != 0) {
      res->last = n;
      goto LAB_00190b43;
    }
    n = n + -1;
  } while( true );
}

Assistant:

static void SetResidualCoeffs_C(const int16_t* WEBP_RESTRICT const coeffs,
                                VP8Residual* WEBP_RESTRICT const res) {
  int n;
  res->last = -1;
  assert(res->first == 0 || coeffs[0] == 0);
  for (n = 15; n >= 0; --n) {
    if (coeffs[n]) {
      res->last = n;
      break;
    }
  }
  res->coeffs = coeffs;
}